

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B2A_adapter.h
# Opt level: O3

void __thiscall adapter::B2AAdapter::~B2AAdapter(B2AAdapter *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_ASocket)._vptr_ASocket = (_func_int **)&PTR_charge_001297e0;
  p_Var1 = (this->pbplug_).super___shared_ptr<adapter::BPlug,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  (this->super_ASocket)._vptr_ASocket = (_func_int **)&PTR_charge_001297c8;
  p_Var1 = (this->super_ASocket).paplug_.
           super___shared_ptr<adapter::APlug,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    return;
  }
  return;
}

Assistant:

B2AAdapter::~B2AAdapter() {}